

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O0

void __thiscall
InstructionGenerator::genCreateInt(InstructionGenerator *this,string *identifier,uint val)

{
  Variable local_50;
  Instruction local_20;
  uint local_1c;
  string *psStack_18;
  uint val_local;
  string *identifier_local;
  InstructionGenerator *this_local;
  
  local_20 = CREATE_INT;
  local_1c = val;
  psStack_18 = identifier;
  identifier_local = (string *)this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<Instruction>
            (this->bytecode,&local_20);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)this->bytecode,&local_1c);
  Variable::Variable(&local_50,psStack_18,INT);
  VirtualStack::push(&this->super_VirtualStack,&local_50);
  Variable::~Variable(&local_50);
  return;
}

Assistant:

void InstructionGenerator::genCreateInt(const std::string &identifier, unsigned int val)
{
    bytecode->emplace_back(Instruction::CREATE_INT);
    bytecode->emplace_back(val);
    push(Variable(identifier, DataType::INT));
}